

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathHasSameNodes(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  uint uVar1;
  int iVar2;
  xmlNodePtr val;
  ulong uVar3;
  
  if (nodes1 != (xmlNodeSetPtr)0x0) {
    uVar1 = nodes1->nodeNr;
    if (((((ulong)uVar1 != 0) && (nodes2 != (xmlNodeSetPtr)0x0)) &&
        (nodes1->nodeTab != (xmlNodePtr *)0x0)) &&
       ((nodes2->nodeNr != 0 && (0 < (int)uVar1 && nodes2->nodeTab != (xmlNodePtr *)0x0)))) {
      uVar3 = 0;
      do {
        if ((long)uVar3 < (long)nodes1->nodeNr) {
          val = nodes1->nodeTab[uVar3];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
        iVar2 = xmlXPathNodeSetContains(nodes2,val);
        if (iVar2 != 0) {
          return 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return 0;
}

Assistant:

int
xmlXPathHasSameNodes (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    int i, l;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes1) ||
	xmlXPathNodeSetIsEmpty(nodes2))
	return(0);

    l = xmlXPathNodeSetGetLength(nodes1);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (xmlXPathNodeSetContains(nodes2, cur))
	    return(1);
    }
    return(0);
}